

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Gia_ManAppendBuf(Gia_Man_t *p,int iLit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  
  pObj = Gia_ManAppendObj(p);
  iVar1 = Abc_Lit2Var(iLit);
  if (iVar1 < p->nObjs) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar2 = Abc_Lit2Var(iLit);
    uVar4 = (ulong)(iVar1 - iVar2 & 0x1fffffff);
    *(ulong *)pObj = *(ulong *)pObj & 0xe0000000e0000000 | uVar4 << 0x20 | uVar4;
    uVar3 = Abc_LitIsCompl(iLit);
    *(ulong *)pObj =
         (ulong)(uVar3 << 0x1d) | *(ulong *)pObj & 0xdfffffffdfffffff | (ulong)uVar3 << 0x3d;
    p->nBufs = p->nBufs + 1;
    iVar1 = Gia_ObjId(p,pObj);
    return iVar1 * 2;
  }
  __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2e3,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendBuf( Gia_Man_t * p, int iLit )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p) );
    pObj->iDiff0  = pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit);
    pObj->fCompl0 = pObj->fCompl1 = Abc_LitIsCompl(iLit);
    p->nBufs++;
    return Gia_ObjId( p, pObj ) << 1;
}